

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitRefI31(BinaryInstWriter *this,RefI31 *curr)

{
  bool bVar1;
  BufferWithRandomAccess *this_00;
  uint value;
  HeapType local_28;
  U32LEB local_1c;
  RefI31 *local_18;
  RefI31 *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (RefI31 *)this;
  this_00 = BufferWithRandomAccess::operator<<(this->o,-5);
  local_28 = wasm::Type::getHeapType
                       (&(local_18->super_SpecificExpression<(wasm::Expression::Id)59>).
                         super_Expression.type);
  bVar1 = HeapType::isShared(&local_28);
  value = 0x1c;
  if (bVar1) {
    value = 0x1f;
  }
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,value);
  BufferWithRandomAccess::operator<<(this_00,local_1c);
  return;
}

Assistant:

void BinaryInstWriter::visitRefI31(RefI31* curr) {
  o << int8_t(BinaryConsts::GCPrefix)
    << U32LEB(curr->type.getHeapType().isShared() ? BinaryConsts::RefI31Shared
                                                  : BinaryConsts::RefI31);
}